

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O2

int xmlUCSIsCatMe(int code)

{
  uint uVar1;
  
  uVar1 = 1;
  if (((1 < code - 0x488U) && (code != 0x6de)) && (3 < code - 0x20ddU)) {
    uVar1 = (uint)(code - 0x20e2U < 3);
  }
  return uVar1;
}

Assistant:

int
xmlUCSIsCatMe(int code) {
    return(((code >= 0x488) && (code <= 0x489)) ||
           (code == 0x6de) ||
           ((code >= 0x20dd) && (code <= 0x20e0)) ||
           ((code >= 0x20e2) && (code <= 0x20e4)));
}